

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O1

void * __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this,size_t Size,
          size_t Alignment)

{
  ulong uVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  pair<void_*,_unsigned_long> local_40;
  
  if (Alignment == 0) {
    __assert_fail("Alignment > 0 && \"0-byte alignnment is not allowed. Use 1 instead.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Allocator.h"
                  ,0xd8,
                  "void *llvm::BumpPtrAllocatorImpl<>::Allocate(size_t, size_t) [AllocatorT = llvm::MallocAllocator, SlabSize = 4096, SizeThreshold = 4096]"
                 );
  }
  this->BytesAllocated = this->BytesAllocated + Size;
  uVar1 = Alignment - 1;
  if ((Alignment ^ uVar1) <= uVar1) {
    __assert_fail("Alignment && isPowerOf2_64((uint64_t)Alignment) && \"Alignment is not a power of two!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/MathExtras.h"
                  ,0x271,"uintptr_t llvm::alignAddr(const void *, size_t)");
  }
  pcVar5 = this->CurPtr;
  if (CARRY8(uVar1,(ulong)pcVar5)) goto LAB_001687e1;
  uVar4 = -Alignment;
  uVar3 = ((ulong)(pcVar5 + uVar1) & uVar4) - (long)pcVar5;
  if (CARRY8(uVar3,Size)) {
    __assert_fail("Adjustment + Size >= Size && \"Adjustment + Size must not overflow\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Allocator.h"
                  ,0xde,
                  "void *llvm::BumpPtrAllocatorImpl<>::Allocate(size_t, size_t) [AllocatorT = llvm::MallocAllocator, SlabSize = 4096, SizeThreshold = 4096]"
                 );
  }
  if ((ulong)((long)this->End - (long)pcVar5) < uVar3 + Size) {
    uVar3 = (Alignment + Size) - 1;
    if (uVar3 < 0x1001) {
      StartNewSlab(this);
      if (CARRY8(uVar1,(ulong)this->CurPtr)) goto LAB_001687e1;
      pcVar5 = (char *)((ulong)(this->CurPtr + uVar1) & uVar4);
      if (this->End < pcVar5 + Size) {
        __assert_fail("AlignedAddr + SizeToAllocate <= (uintptr_t)End && \"Unable to allocate memory!\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Allocator.h"
                      ,0x108,
                      "void *llvm::BumpPtrAllocatorImpl<>::Allocate(size_t, size_t) [AllocatorT = llvm::MallocAllocator, SlabSize = 4096, SizeThreshold = 4096]"
                     );
      }
      this->CurPtr = pcVar5 + Size;
    }
    else {
      pvVar2 = malloc(uVar3);
      if (pvVar2 == (void *)0x0) {
        report_bad_alloc_error("Allocation failed",true);
      }
      local_40.first = pvVar2;
      local_40.second = uVar3;
      SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>::push_back
                ((SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true> *)
                 &this->CustomSizedSlabs,&local_40);
      if (CARRY8(uVar1,(ulong)pvVar2)) {
LAB_001687e1:
        __assert_fail("(uintptr_t)Addr + Alignment - 1 >= (uintptr_t)Addr",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/MathExtras.h"
                      ,0x273,"uintptr_t llvm::alignAddr(const void *, size_t)");
      }
      pcVar5 = (char *)(uVar1 + (long)pvVar2 & uVar4);
      if ((char *)(uVar3 + (long)pvVar2) < pcVar5 + Size) {
        __assert_fail("AlignedAddr + Size <= (uintptr_t)NewSlab + PaddedSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Allocator.h"
                      ,0xfd,
                      "void *llvm::BumpPtrAllocatorImpl<>::Allocate(size_t, size_t) [AllocatorT = llvm::MallocAllocator, SlabSize = 4096, SizeThreshold = 4096]"
                     );
      }
    }
  }
  else {
    pcVar5 = pcVar5 + uVar3;
    this->CurPtr = pcVar5 + Size;
  }
  return pcVar5;
}

Assistant:

void *
  Allocate(size_t Size, size_t Alignment) {
    assert(Alignment > 0 && "0-byte alignnment is not allowed. Use 1 instead.");

    // Keep track of how many bytes we've allocated.
    BytesAllocated += Size;

    size_t Adjustment = alignmentAdjustment(CurPtr, Alignment);
    assert(Adjustment + Size >= Size && "Adjustment + Size must not overflow");

    size_t SizeToAllocate = Size;
#if LLVM_ADDRESS_SANITIZER_BUILD
    // Add trailing bytes as a "red zone" under ASan.
    SizeToAllocate += RedZoneSize;
#endif

    // Check if we have enough space.
    if (Adjustment + SizeToAllocate <= size_t(End - CurPtr)) {
      char *AlignedPtr = CurPtr + Adjustment;
      CurPtr = AlignedPtr + SizeToAllocate;
      // Update the allocation point of this memory block in MemorySanitizer.
      // Without this, MemorySanitizer messages for values originated from here
      // will point to the allocation of the entire slab.
      __msan_allocated_memory(AlignedPtr, Size);
      // Similarly, tell ASan about this space.
      __asan_unpoison_memory_region(AlignedPtr, Size);
      return AlignedPtr;
    }

    // If Size is really big, allocate a separate slab for it.
    size_t PaddedSize = SizeToAllocate + Alignment - 1;
    if (PaddedSize > SizeThreshold) {
      void *NewSlab = Allocator.Allocate(PaddedSize, 0);
      // We own the new slab and don't want anyone reading anyting other than
      // pieces returned from this method.  So poison the whole slab.
      __asan_poison_memory_region(NewSlab, PaddedSize);
      CustomSizedSlabs.push_back(std::make_pair(NewSlab, PaddedSize));

      uintptr_t AlignedAddr = alignAddr(NewSlab, Alignment);
      assert(AlignedAddr + Size <= (uintptr_t)NewSlab + PaddedSize);
      char *AlignedPtr = (char*)AlignedAddr;
      __msan_allocated_memory(AlignedPtr, Size);
      __asan_unpoison_memory_region(AlignedPtr, Size);
      return AlignedPtr;
    }

    // Otherwise, start a new slab and try again.
    StartNewSlab();
    uintptr_t AlignedAddr = alignAddr(CurPtr, Alignment);
    assert(AlignedAddr + SizeToAllocate <= (uintptr_t)End &&
           "Unable to allocate memory!");
    char *AlignedPtr = (char*)AlignedAddr;
    CurPtr = AlignedPtr + SizeToAllocate;
    __msan_allocated_memory(AlignedPtr, Size);
    __asan_unpoison_memory_region(AlignedPtr, Size);
    return AlignedPtr;
  }